

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::ReservoirQuantileState<signed_char>,signed_char,duckdb::ReservoirQuantileListOperation<signed_char>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  unsigned_long *puVar9;
  ulong uVar10;
  data_ptr_t input_00;
  unsigned_long *puVar11;
  idx_t iVar12;
  unsigned_long *puVar13;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_98;
  ValidityMask *local_50;
  AggregateUnaryInput local_48;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar1 = input->data;
    FlatVector::VerifyFlatVector(input);
    local_98.data = (data_ptr_t)&input->validity;
    local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    if (0x3f < count + 0x3f) {
      puVar11 = (unsigned_long *)0x0;
      uVar10 = 0;
      puVar9 = (unsigned_long *)0x0;
      local_98.sel = (SelectionVector *)aggr_input_data;
      local_50 = (ValidityMask *)local_98.data;
      do {
        puVar13 = (local_50->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar13 == (unsigned_long *)0x0) {
          puVar13 = puVar9 + 8;
          if (count <= puVar9 + 8) {
            puVar13 = (unsigned_long *)count;
          }
joined_r0x01a526cc:
          while (puVar8 = puVar11, puVar5 = puVar11,
                puVar6 = local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask,
                puVar11 < puVar13) {
            ReservoirQuantileOperation::
            Operation<signed_char,duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>>
                      ((ReservoirQuantileState<signed_char> *)state,
                       (char *)((long)puVar11 + (long)pdVar1),(AggregateUnaryInput *)&local_98);
            puVar11 = (unsigned_long *)
                      ((long)local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_mask + 1);
            local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar11;
          }
        }
        else {
          uVar2 = puVar13[uVar10];
          puVar13 = puVar9 + 8;
          if (count <= puVar9 + 8) {
            puVar13 = (unsigned_long *)count;
          }
          if (uVar2 == 0xffffffffffffffff) goto joined_r0x01a526cc;
          puVar8 = puVar13;
          puVar5 = puVar13;
          puVar6 = puVar13;
          puVar7 = puVar9;
          puVar4 = local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (uVar2 != 0) {
            while (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                        puVar7,
                  puVar8 = local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                           validity_mask, puVar5 = puVar11, puVar6 = puVar4,
                  local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask <
                  puVar13) {
              if ((uVar2 >> ((ulong)(uint)((int)local_98.validity.
                                                super_TemplatedValidityMask<unsigned_long>.
                                                validity_mask - (int)puVar9) & 0x3f) & 1) != 0) {
                input_00 = (data_ptr_t)
                           ((long)local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                                  validity_mask + (long)pdVar1);
                local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar4;
                ReservoirQuantileOperation::
                Operation<signed_char,duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>>
                          ((ReservoirQuantileState<signed_char> *)state,(char *)input_00,
                           (AggregateUnaryInput *)&local_98);
              }
              puVar11 = (unsigned_long *)
                        ((long)local_98.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask + 1);
              puVar4 = puVar11;
              puVar7 = puVar11;
            }
          }
        }
        local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar6;
        puVar11 = puVar5;
        uVar10 = uVar10 + 1;
        puVar9 = puVar8;
      } while (uVar10 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar11 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar11 == (unsigned_long *)0x0) || ((*puVar11 & 1) != 0)) {
      pdVar1 = input->data;
      local_98.data = (data_ptr_t)&input->validity;
      local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      if (count != 0) {
        local_98.sel = (SelectionVector *)aggr_input_data;
        do {
          ReservoirQuantileOperation::
          Operation<signed_char,duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>>
                    ((ReservoirQuantileState<signed_char> *)state,(char *)pdVar1,
                     (AggregateUnaryInput *)&local_98);
          count = count - 1;
        } while (count != 0);
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_98);
    Vector::ToUnifiedFormat(input,count,&local_98);
    local_48.input_mask = &local_98.validity;
    local_48.input = aggr_input_data;
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar3 = (local_98.sel)->sel_vector;
        iVar12 = 0;
        do {
          local_48.input_idx = iVar12;
          if (psVar3 != (sel_t *)0x0) {
            local_48.input_idx = (idx_t)psVar3[iVar12];
          }
          ReservoirQuantileOperation::
          Operation<signed_char,duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>>
                    ((ReservoirQuantileState<signed_char> *)state,
                     (char *)(local_98.data + local_48.input_idx),&local_48);
          iVar12 = iVar12 + 1;
        } while (count != iVar12);
      }
    }
    else if (count != 0) {
      psVar3 = (local_98.sel)->sel_vector;
      iVar12 = 0;
      do {
        local_48.input_idx = iVar12;
        if (psVar3 != (sel_t *)0x0) {
          local_48.input_idx = (idx_t)psVar3[iVar12];
        }
        if ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [local_48.input_idx >> 6] >> (local_48.input_idx & 0x3f) & 1) != 0)) {
          ReservoirQuantileOperation::
          Operation<signed_char,duckdb::ReservoirQuantileState<signed_char>,duckdb::ReservoirQuantileListOperation<signed_char>>
                    ((ReservoirQuantileState<signed_char> *)state,
                     (char *)(local_98.data + local_48.input_idx),&local_48);
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
    }
    if (local_98.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}